

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaCheckCVCWildcardNamespace(xmlSchemaWildcardPtr wild,xmlChar *ns)

{
  int iVar1;
  xmlSchemaWildcardNsPtr local_28;
  xmlSchemaWildcardNsPtr cur;
  xmlChar *ns_local;
  xmlSchemaWildcardPtr wild_local;
  
  if (wild == (xmlSchemaWildcardPtr)0x0) {
    wild_local._4_4_ = -1;
  }
  else if (wild->any == 0) {
    if (wild->nsSet == (xmlSchemaWildcardNsPtr)0x0) {
      if (((wild->negNsSet != (xmlSchemaWildcardNsPtr)0x0) && (ns != (xmlChar *)0x0)) &&
         (iVar1 = xmlStrEqual(wild->negNsSet->value,ns), iVar1 == 0)) {
        return 0;
      }
    }
    else {
      for (local_28 = wild->nsSet; local_28 != (xmlSchemaWildcardNsPtr)0x0;
          local_28 = local_28->next) {
        iVar1 = xmlStrEqual(local_28->value,ns);
        if (iVar1 != 0) {
          return 0;
        }
      }
    }
    wild_local._4_4_ = 1;
  }
  else {
    wild_local._4_4_ = 0;
  }
  return wild_local._4_4_;
}

Assistant:

static int
xmlSchemaCheckCVCWildcardNamespace(xmlSchemaWildcardPtr wild,
				   const xmlChar* ns)
{
    if (wild == NULL)
	return(-1);

    if (wild->any)
	return(0);
    else if (wild->nsSet != NULL) {
	xmlSchemaWildcardNsPtr cur;

	cur = wild->nsSet;
	while (cur != NULL) {
	    if (xmlStrEqual(cur->value, ns))
		return(0);
	    cur = cur->next;
	}
    } else if ((wild->negNsSet != NULL) && (ns != NULL) &&
	(!xmlStrEqual(wild->negNsSet->value, ns)))
	return(0);

    return(1);
}